

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.cpp
# Opt level: O2

SP __thiscall pbrt::SemanticParser::emitPlyMesh(SemanticParser *this,SP *shape)

{
  element_type *peVar1;
  element_type *peVar2;
  element_type *peVar3;
  element_type *peVar4;
  size_type sVar5;
  __shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  vec3f *v_1;
  element_type *n;
  vec3f *v;
  element_type *b;
  SP SVar6;
  vec3f vVar7;
  SP ours;
  affine3f xfm;
  string fileName;
  allocator local_d9;
  string local_d8;
  undefined1 local_b8 [64];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  __shared_ptr<pbrt::Shape,(__gnu_cxx::_Lock_policy)2> local_70 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  __shared_ptr<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  peVar1 = shape[1].super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar2 = in_RDX->_M_ptr;
  std::__cxx11::string::string((string *)&local_d8,"filename",&local_d9);
  syntactic::ParamSet::getParamString
            ((string *)local_b8,&(peVar2->super_Node).super_ParamSet,&local_d8);
  std::operator+(&local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(peVar1->transform).atStart.l.vz,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__shared_ptr<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_60,
             &(in_RDX->_M_ptr->material).
              super___shared_ptr<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2>);
  findOrCreateMaterial((SemanticParser *)local_b8,(SP *)shape);
  std::make_shared<pbrt::TriangleMesh,std::shared_ptr<pbrt::Material>>
            ((shared_ptr<pbrt::Material> *)&local_d8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b8 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
  pbrt::ply::parse(&local_50,
                   (vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *)
                   (local_d8._M_dataplus._M_p + 0x70),
                   (vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *)
                   (local_d8._M_dataplus._M_p + 0x88),
                   (vector<pbrt::math::vec2f,_std::allocator<pbrt::math::vec2f>_> *)
                   (local_d8._M_dataplus._M_p + 0xa0),
                   (vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_> *)
                   (local_d8._M_dataplus._M_p + 0xb8));
  peVar1 = in_RDX->_M_ptr;
  local_b8._0_8_ = *(undefined8 *)&(peVar1->transform).atStart.l.vx;
  local_b8._8_8_ = *(undefined8 *)&(peVar1->transform).atStart.l.vx.z;
  local_b8._16_4_ = (peVar1->transform).atStart.l.vy.y;
  local_b8._20_4_ = (peVar1->transform).atStart.l.vy.z;
  local_b8._24_4_ = (peVar1->transform).atStart.l.vz.x;
  local_b8._28_4_ = (peVar1->transform).atStart.l.vz.y;
  local_b8._32_8_ = *(undefined8 *)&(peVar1->transform).atStart.l.vz.z;
  local_b8._40_4_ = (_Rb_tree_color)(peVar1->transform).atStart.p.y;
  local_b8._44_4_ = (peVar1->transform).atStart.p.z;
  peVar3 = (element_type *)
           ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d8._M_dataplus._M_p + 0x78))->_M_pi
  ;
  for (b = (((SP *)(local_d8._M_dataplus._M_p + 0x70))->
           super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>)._M_ptr; b != peVar3;
      b = (element_type *)((long)&(b->super_Entity).super_enable_shared_from_this<pbrt::Entity> + 4)
      ) {
    vVar7 = math::operator*((affine3f *)local_b8,(vec3f *)b);
    (b->super_Entity)._vptr_Entity = vVar7._0_8_;
    *(float *)&(b->super_Entity).super_enable_shared_from_this<pbrt::Entity>._M_weak_this.
               super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2> = vVar7.z;
  }
  peVar4 = (element_type *)
           ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_d8._M_dataplus._M_p + 0x90))->_M_pi;
  for (n = (((enable_shared_from_this<pbrt::Entity> *)(local_d8._M_dataplus._M_p + 0x88))->
           _M_weak_this).super___weak_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      n != peVar4; n = (element_type *)((long)&n->super_enable_shared_from_this<pbrt::Entity> + 4))
  {
    vVar7 = math::xfmNormal((affine3f *)local_b8,(vec3f *)n);
    n->_vptr_Entity = vVar7._0_8_;
    *(float *)&(n->super_enable_shared_from_this<pbrt::Entity>)._M_weak_this = vVar7.z;
  }
  std::__shared_ptr<pbrt::Shape,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<pbrt::TriangleMesh,void>
            (local_70,(__shared_ptr<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2> *)&local_d8);
  std::__shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2> *)(local_b8 + 0x38),
             in_RDX);
  extractTextures((SemanticParser *)shape,(SP *)local_70,(SP *)(local_b8 + 0x38));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68);
  sVar5 = local_d8._M_string_length;
  local_d8._M_string_length = 0;
  (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_d8._M_dataplus._M_p;
  (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar5;
  local_d8._M_dataplus._M_p = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_d8._M_string_length);
  std::__cxx11::string::~string((string *)&local_50);
  SVar6.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  SVar6.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (SP)SVar6.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Shape::SP SemanticParser::emitPlyMesh(pbrt::syntactic::Shape::SP shape)
  {
    const std::string fileName
      = pbrtScene->makeGlobalFileName(shape->getParamString("filename"));
    TriangleMesh::SP ours = std::make_shared<TriangleMesh>(findOrCreateMaterial(shape->material));
    ply::parse(fileName,ours->vertex,ours->normal,ours->texcoord,ours->index);

    affine3f xfm = shape->transform.atStart;
    for (vec3f &v : ours->vertex)
      v = xfmPoint(xfm,v);
    for (vec3f &v : ours->normal)
      v = xfmNormal(xfm,v);

    extractTextures(ours,shape);
    return ours;
  }